

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O3

ssize_t __thiscall
duckdb_parquet::OffsetIndex::read(OffsetIndex *this,int __fd,void *__buf,size_t __nbytes)

{
  vector<duckdb_parquet::PageLocation,_true> *this_00;
  pointer pPVar1;
  pointer pPVar2;
  pointer plVar3;
  vector<long,_true> *this_01;
  int iVar4;
  int iVar5;
  int iVar6;
  reference pvVar7;
  undefined4 extraout_var;
  reference pvVar8;
  undefined8 *puVar9;
  undefined4 in_register_00000034;
  TProtocol *this_02;
  pointer pPVar10;
  size_type __n;
  size_type __n_00;
  uint32_t _size160;
  int16_t fid;
  TType _etype163;
  TType ftype;
  string fname;
  uint local_78;
  short local_72;
  undefined1 local_70 [4];
  int local_6c;
  ulong local_68;
  vector<long,_true> *local_60;
  OffsetIndex *local_58;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  
  this_02 = (TProtocol *)CONCAT44(in_register_00000034,__fd);
  duckdb_apache::thrift::protocol::TProtocol::incrementInputRecursionDepth(this_02);
  local_50 = local_40;
  local_48 = 0;
  local_40[0] = 0;
  iVar4 = (*this_02->_vptr_TProtocol[0x19])(this_02,&local_50);
  local_60 = &this->unencoded_byte_array_data_bytes;
  this_00 = &this->page_locations;
  local_68 = 0;
  local_58 = this;
  do {
    iVar5 = (*this_02->_vptr_TProtocol[0x1b])(this_02,&local_50,&local_6c,&local_72);
    iVar5 = iVar5 + iVar4;
    if (local_6c == 0) {
      iVar4 = (*this_02->_vptr_TProtocol[0x1a])(this_02);
      if ((local_68 & 1) == 0) {
        puVar9 = (undefined8 *)__cxa_allocate_exception(0x30);
        puVar9[1] = puVar9 + 3;
        puVar9[2] = 0;
        *(undefined1 *)(puVar9 + 3) = 0;
        *puVar9 = &PTR__TException_004998a8;
        *(undefined4 *)(puVar9 + 5) = 1;
        __cxa_throw(puVar9,&duckdb_apache::thrift::protocol::TProtocolException::typeinfo,
                    duckdb_apache::thrift::TException::~TException);
      }
      if (local_50 != local_40) {
        operator_delete(local_50);
      }
      this_02->input_recursion_depth_ = this_02->input_recursion_depth_ - 1;
      return (ulong)(uint)(iVar4 + iVar5);
    }
    if (local_72 == 2) {
      if (local_6c != 0xf) {
        iVar6 = (*this_02->_vptr_TProtocol[0x2c])(this_02);
        goto LAB_002d5194;
      }
      plVar3 = (this->unencoded_byte_array_data_bytes).super_vector<long,_std::allocator<long>_>.
               super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
               _M_start;
      if ((this->unencoded_byte_array_data_bytes).super_vector<long,_std::allocator<long>_>.
          super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish
          != plVar3) {
        (this->unencoded_byte_array_data_bytes).super_vector<long,_std::allocator<long>_>.
        super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish =
             plVar3;
      }
      iVar4 = (*this_02->_vptr_TProtocol[0x1f])(this_02,local_70,&local_78);
      std::vector<long,_std::allocator<long>_>::resize
                (&local_60->super_vector<long,_std::allocator<long>_>,(ulong)local_78);
      this_01 = local_60;
      iVar4 = iVar4 + iVar5;
      if (local_78 != 0) {
        __n_00 = 0;
        do {
          pvVar8 = duckdb::vector<long,_true>::operator[](this_01,__n_00);
          iVar5 = (*this_02->_vptr_TProtocol[0x28])(this_02,pvVar8);
          iVar4 = iVar4 + iVar5;
          __n_00 = __n_00 + 1;
        } while (__n_00 < local_78);
      }
      iVar6 = (*this_02->_vptr_TProtocol[0x20])(this_02);
      iVar6 = iVar6 + iVar4;
      this->__isset = (_OffsetIndex__isset)((byte)this->__isset | 1);
    }
    else {
      if (local_72 == 1) {
        if (local_6c == 0xf) {
          pPVar1 = (this->page_locations).
                   super_vector<duckdb_parquet::PageLocation,_std::allocator<duckdb_parquet::PageLocation>_>
                   .
                   super__Vector_base<duckdb_parquet::PageLocation,_std::allocator<duckdb_parquet::PageLocation>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pPVar2 = (this->page_locations).
                   super_vector<duckdb_parquet::PageLocation,_std::allocator<duckdb_parquet::PageLocation>_>
                   .
                   super__Vector_base<duckdb_parquet::PageLocation,_std::allocator<duckdb_parquet::PageLocation>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          pPVar10 = pPVar1;
          if (pPVar2 != pPVar1) {
            do {
              (*(code *)**(undefined8 **)pPVar10)(pPVar10);
              pPVar10 = pPVar10 + 1;
            } while (pPVar10 != pPVar2);
            (local_58->page_locations).
            super_vector<duckdb_parquet::PageLocation,_std::allocator<duckdb_parquet::PageLocation>_>
            .
            super__Vector_base<duckdb_parquet::PageLocation,_std::allocator<duckdb_parquet::PageLocation>_>
            ._M_impl.super__Vector_impl_data._M_finish = pPVar1;
          }
          iVar6 = (*this_02->_vptr_TProtocol[0x1f])(this_02,local_70,&local_78);
          std::vector<duckdb_parquet::PageLocation,_std::allocator<duckdb_parquet::PageLocation>_>::
          resize(&this_00->
                  super_vector<duckdb_parquet::PageLocation,_std::allocator<duckdb_parquet::PageLocation>_>
                 ,(ulong)local_78);
          this = local_58;
          iVar6 = iVar6 + iVar5;
          if (local_78 != 0) {
            __n = 0;
            do {
              pvVar7 = duckdb::vector<duckdb_parquet::PageLocation,_true>::operator[](this_00,__n);
              iVar4 = (**(code **)(*(long *)pvVar7 + 0x10))(pvVar7,this_02);
              iVar6 = iVar6 + iVar4;
              __n = __n + 1;
            } while (__n < local_78);
          }
          iVar4 = (*this_02->_vptr_TProtocol[0x20])(this_02);
          iVar6 = iVar4 + iVar6;
          local_68 = CONCAT71((int7)(CONCAT44(extraout_var,iVar4) >> 8),1);
          goto LAB_002d519a;
        }
        iVar6 = (*this_02->_vptr_TProtocol[0x2c])(this_02);
      }
      else {
        iVar6 = (*this_02->_vptr_TProtocol[0x2c])(this_02);
      }
LAB_002d5194:
      iVar6 = iVar6 + iVar5;
    }
LAB_002d519a:
    iVar4 = (*this_02->_vptr_TProtocol[0x1c])(this_02);
    iVar4 = iVar4 + iVar6;
  } while( true );
}

Assistant:

uint32_t OffsetIndex::read(::apache::thrift::protocol::TProtocol* iprot) {

  ::apache::thrift::protocol::TInputRecursionTracker tracker(*iprot);
  uint32_t xfer = 0;
  std::string fname;
  ::apache::thrift::protocol::TType ftype;
  int16_t fid;

  xfer += iprot->readStructBegin(fname);

  using ::apache::thrift::protocol::TProtocolException;

  bool isset_page_locations = false;

  while (true)
  {
    xfer += iprot->readFieldBegin(fname, ftype, fid);
    if (ftype == ::apache::thrift::protocol::T_STOP) {
      break;
    }
    switch (fid)
    {
      case 1:
        if (ftype == ::apache::thrift::protocol::T_LIST) {
          {
            this->page_locations.clear();
            uint32_t _size160;
            ::apache::thrift::protocol::TType _etype163;
            xfer += iprot->readListBegin(_etype163, _size160);
            this->page_locations.resize(_size160);
            uint32_t _i164;
            for (_i164 = 0; _i164 < _size160; ++_i164)
            {
              xfer += this->page_locations[_i164].read(iprot);
            }
            xfer += iprot->readListEnd();
          }
          isset_page_locations = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 2:
        if (ftype == ::apache::thrift::protocol::T_LIST) {
          {
            this->unencoded_byte_array_data_bytes.clear();
            uint32_t _size165;
            ::apache::thrift::protocol::TType _etype168;
            xfer += iprot->readListBegin(_etype168, _size165);
            this->unencoded_byte_array_data_bytes.resize(_size165);
            uint32_t _i169;
            for (_i169 = 0; _i169 < _size165; ++_i169)
            {
              xfer += iprot->readI64(this->unencoded_byte_array_data_bytes[_i169]);
            }
            xfer += iprot->readListEnd();
          }
          this->__isset.unencoded_byte_array_data_bytes = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      default:
        xfer += iprot->skip(ftype);
        break;
    }
    xfer += iprot->readFieldEnd();
  }

  xfer += iprot->readStructEnd();

  if (!isset_page_locations)
    throw TProtocolException(TProtocolException::INVALID_DATA);
  return xfer;
}